

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O0

undefined8 __thiscall
cpsm::Matcher<cpsm::NonPathTraits,cpsm::SimpleStringTraits>::score_debug_string_abi_cxx11_
          (Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> *this)

{
  long in_RSI;
  undefined8 in_RDI;
  char *in_stack_00000148;
  bool in_stack_00000157;
  char *in_stack_00000158;
  unsigned_long in_stack_00000160;
  char *in_stack_00000168;
  unsigned_long in_stack_000001b0;
  char *in_stack_000001b8;
  unsigned_long in_stack_000001c0;
  char *in_stack_000001c8;
  unsigned_long in_stack_000001d0;
  char *in_stack_000001d8;
  unsigned_long in_stack_000001e0;
  char *in_stack_000001e8;
  unsigned_long in_stack_000001f0;
  char *in_stack_000001f8;
  unsigned_long in_stack_00000200;
  char *in_stack_00000208;
  unsigned_long in_stack_00000210;
  
  std::vector<char,_std::allocator<char>_>::size
            ((vector<char,_std::allocator<char>_> *)(in_RSI + 8));
  str_cat<char_const*,unsigned_long,char_const*,bool,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
            (in_stack_00000168,in_stack_00000160,in_stack_00000158,in_stack_00000157,
             in_stack_00000148,in_stack_000001b0,in_stack_000001b8,in_stack_000001c0,
             in_stack_000001c8,in_stack_000001d0,in_stack_000001d8,in_stack_000001e0,
             in_stack_000001e8,in_stack_000001f0,in_stack_000001f8,in_stack_00000200,
             in_stack_00000208,in_stack_00000210);
  return in_RDI;
}

Assistant:

std::string score_debug_string() const final {
    return str_cat("prefix_level = ", Score(prefix_level_),
                   ", whole_basename_match = ", whole_basename_match_,
                   ", basename_longest_submatch = ", basename_longest_submatch_,
                   ", basename_match_count = ", basename_match_count_,
                   ", basename_word_gaps = ", basename_word_gaps_,
                   ", crfile_basename_shared_words = ",
                   crfile_basename_shared_words_, ", crfile_path_distance = ",
                   crfile_path_distance_, ", unmatched_suffix_len = ",
                   unmatched_suffix_len_, ", item_len = ", item_.size());
  }